

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::RABlock::prependSuccessor(RABlock *this,RABlock *successor)

{
  bool bVar1;
  Error EVar2;
  RABlock *predecessor;
  RABlock *successor_local;
  
  predecessor = this;
  successor_local = successor;
  bVar1 = ZoneVector<asmjit::RABlock_*>::contains(&this->_successors,&successor_local);
  EVar2 = 0;
  if (!bVar1) {
    bVar1 = ZoneVector<asmjit::RABlock_*>::contains(&successor_local->_predecessors,&predecessor);
    if (bVar1) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/rapass.cpp"
                 ,0x3d,"!successor->_predecessors.contains(predecessor)");
    }
    EVar2 = ZoneVector<asmjit::RABlock_*>::willGrow
                      (&successor_local->_predecessors,&this->_ra->_allocator,1);
    if ((EVar2 == 0) &&
       (EVar2 = ZoneVector<asmjit::RABlock_*>::willGrow
                          (&predecessor->_successors,&this->_ra->_allocator,1), EVar2 == 0)) {
      ZoneVector<asmjit::RABlock_*>::prependUnsafe(&predecessor->_successors,&successor_local);
      ZoneVector<asmjit::RABlock_*>::prependUnsafe(&successor_local->_predecessors,&predecessor);
      EVar2 = 0;
    }
  }
  return EVar2;
}

Assistant:

Error RABlock::prependSuccessor(RABlock* successor) noexcept {
  RABlock* predecessor = this;

  if (predecessor->_successors.contains(successor))
    return kErrorOk;
  ASMJIT_ASSERT(!successor->_predecessors.contains(predecessor));

  ASMJIT_PROPAGATE(successor->_predecessors.willGrow(allocator()));
  ASMJIT_PROPAGATE(predecessor->_successors.willGrow(allocator()));

  predecessor->_successors.prependUnsafe(successor);
  successor->_predecessors.prependUnsafe(predecessor);

  return kErrorOk;
}